

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeDrop(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  Expression *pEVar1;
  Expression *pEVar2;
  
  type_00 = getConcreteType(this);
  pEVar1 = make(this,type_00);
  pEVar2 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
  pEVar2->_id = DropId;
  (pEVar2->type).id = 0;
  *(Expression **)(pEVar2 + 1) = pEVar1;
  ::wasm::Drop::finalize();
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeDrop(Type type) {
  return builder.makeDrop(make(getConcreteType()));
}